

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

long __thiscall duckdb::Value::GetValueInternal<long>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  long lVar3;
  string *psVar4;
  NotImplementedException *this_00;
  InternalException *pIVar5;
  int64_t in_RDX;
  interval_t input;
  LogicalType local_a0;
  Value local_88;
  string local_48;
  anon_union_16_2_67f50693_for_value local_28;
  
  if (this->is_null == true) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Calling GetValueInternal on a value that is NULL",
               (allocator *)&local_a0);
    InternalException::InternalException(pIVar5,(string *)&local_88);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    lVar3 = Cast::Operation<bool,long>((this->value_).boolean);
    return lVar3;
  case TINYINT:
    lVar3 = Cast::Operation<signed_char,long>((this->value_).tinyint);
    return lVar3;
  case SMALLINT:
    lVar3 = Cast::Operation<short,long>((this->value_).smallint);
    return lVar3;
  case INTEGER:
    lVar3 = Cast::Operation<int,long>((this->value_).integer);
    return lVar3;
  case BIGINT:
    lVar3 = Cast::Operation<long,long>((this->value_).bigint);
    return lVar3;
  case DATE:
    lVar3 = Cast::Operation<duckdb::date_t,long>((date_t)(this->value_).date.days);
    return lVar3;
  case TIME:
    lVar3 = Cast::Operation<duckdb::dtime_t,long>((dtime_t)(this->value_).time.micros);
    return lVar3;
  case TIMESTAMP_SEC:
    lVar3 = Cast::Operation<duckdb::timestamp_sec_t,long>
                      ((timestamp_sec_t)(this->value_).timestamp_s.super_timestamp_t.value);
    return lVar3;
  case TIMESTAMP_MS:
    lVar3 = Cast::Operation<duckdb::timestamp_ms_t,long>
                      ((timestamp_ms_t)(this->value_).timestamp_ms.super_timestamp_t.value);
    return lVar3;
  case TIMESTAMP:
    lVar3 = Cast::Operation<duckdb::timestamp_t,long>((timestamp_t)(this->value_).timestamp.value);
    return lVar3;
  case TIMESTAMP_NS:
    lVar3 = Cast::Operation<duckdb::timestamp_ns_t,long>
                      ((timestamp_ns_t)(this->value_).timestamp_ns.super_timestamp_t.value);
    return lVar3;
  case DECIMAL:
    LogicalType::LogicalType(&local_a0,DOUBLE);
    DefaultCastAs(&local_88,this,&local_a0,false);
    lVar3 = GetValueInternal<long>(&local_88);
    ~Value(&local_88);
    LogicalType::~LogicalType(&local_a0);
    break;
  case FLOAT:
    lVar3 = Cast::Operation<float,long>((this->value_).float_);
    return lVar3;
  case DOUBLE:
    lVar3 = Cast::Operation<double,long>((this->value_).double_);
    return lVar3;
  case VARCHAR:
    psVar4 = StringValue::Get_abi_cxx11_(this);
    string_t::string_t((string_t *)&local_28.pointer,(psVar4->_M_dataplus)._M_p);
    lVar3 = Cast::Operation<duckdb::string_t,long>((string_t)local_28);
    break;
  case INTERVAL:
    input.micros = in_RDX;
    input._0_8_ = (this->value_).hugeint.upper;
    lVar3 = Cast::Operation<duckdb::interval_t,long>((Cast *)(this->value_).bigint,input);
    return lVar3;
  case UTINYINT:
switchD_016f9147_caseD_1c:
    lVar3 = Cast::Operation<unsigned_char,long>((this->value_).utinyint);
    return lVar3;
  case USMALLINT:
switchD_016f9147_caseD_1d:
    lVar3 = Cast::Operation<unsigned_short,long>((this->value_).usmallint);
    return lVar3;
  case UINTEGER:
switchD_016f9147_caseD_1e:
    lVar3 = Cast::Operation<unsigned_int,long>((this->value_).uinteger);
    return lVar3;
  case UBIGINT:
    lVar3 = Cast::Operation<unsigned_long,long>((this->value_).ubigint);
    return lVar3;
  case TIMESTAMP_TZ:
    lVar3 = Cast::Operation<duckdb::timestamp_tz_t,long>
                      ((timestamp_tz_t)(this->value_).timestamp_tz.super_timestamp_t.value);
    return lVar3;
  case TIME_TZ:
    lVar3 = Cast::Operation<duckdb::dtime_tz_t,long>((dtime_tz_t)(this->value_).timetz.bits);
    return lVar3;
  case UHUGEINT:
    lVar3 = Cast::Operation<duckdb::uhugeint_t,long>((this->value_).uhugeint);
    return lVar3;
  case HUGEINT:
  case UUID:
    lVar3 = Cast::Operation<duckdb::hugeint_t,long>((this->value_).hugeint);
    return lVar3;
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) goto switchD_016f9147_caseD_1e;
      if (PVar2 == UINT16) goto switchD_016f9147_caseD_1d;
      if (PVar2 != UINT8) {
        pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_88,"Invalid Internal Type for ENUMs",(allocator *)&local_a0);
        InternalException::InternalException(pIVar5,(string *)&local_88);
        __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_016f9147_caseD_1c;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Unimplemented type \"%s\" for GetValue()",(allocator *)&local_a0
              );
    LogicalType::ToString_abi_cxx11_(&local_48,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,(string *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return lVar3;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}